

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall
CGraphics_Threaded::SetColorVertex(CGraphics_Threaded *this,CColorVertex *pArray,int Num)

{
  CColor *pCVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x215,(uint)(this->m_Drawing != 0),
                 "called Graphics()->SetColorVertex without begin");
  if (0 < Num) {
    lVar5 = 0;
    do {
      puVar2 = (undefined8 *)((long)&pArray->m_R + lVar5);
      uVar3 = *puVar2;
      uVar4 = puVar2[1];
      pCVar1 = this->m_aColor + *(int *)((long)&pArray->m_Index + lVar5);
      pCVar1->r = (float)(int)uVar3;
      pCVar1->g = (float)(int)((ulong)uVar3 >> 0x20);
      pCVar1->b = (float)(int)uVar4;
      pCVar1->a = (float)(int)((ulong)uVar4 >> 0x20);
      lVar5 = lVar5 + 0x14;
    } while ((ulong)(uint)Num * 0x14 != lVar5);
  }
  return;
}

Assistant:

void CGraphics_Threaded::SetColorVertex(const CColorVertex *pArray, int Num)
{
	dbg_assert(m_Drawing != 0, "called Graphics()->SetColorVertex without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aColor[pArray[i].m_Index].r = pArray[i].m_R;
		m_aColor[pArray[i].m_Index].g = pArray[i].m_G;
		m_aColor[pArray[i].m_Index].b = pArray[i].m_B;
		m_aColor[pArray[i].m_Index].a = pArray[i].m_A;
	}
}